

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecmanager.cxx
# Opt level: O1

string * __thiscall
vigra::CodecManager::getFileTypeByMagicString
          (string *__return_storage_ptr__,CodecManager *this,string *filename)

{
  pointer pcVar1;
  char *message;
  int iVar2;
  pointer ppVar3;
  ContractViolation *this_00;
  size_t __n;
  size_type *psVar4;
  bool bVar5;
  char fmagic [4];
  string msg;
  ifstream stream;
  undefined1 local_25c [4];
  char *local_258 [2];
  char local_248 [16];
  long local_238 [4];
  int aiStack_218 [122];
  
  std::ifstream::ifstream(local_238,(filename->_M_dataplus)._M_p,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) != 0) {
    local_258[0] = local_248;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"Unable to open file \'","")
    ;
    std::__cxx11::string::_M_append((char *)local_258,(ulong)(filename->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)local_258);
    message = local_258[0];
    this_00 = (ContractViolation *)__cxa_allocate_exception(0x28);
    ContractViolation::ContractViolation
              (this_00,"Precondition violation!",message,
               "/workspace/llm4binary/github/license_c_cmakelists/ukoethe[P]vigra/src/impex/codecmanager.cxx"
               ,0xcb);
    *(undefined ***)this_00 = &PTR__ContractViolation_0015ca28;
    __cxa_throw(this_00,&PreconditionViolation::typeinfo,ContractViolation::~ContractViolation);
  }
  std::istream::read((char *)local_238,(long)local_25c);
  std::ifstream::close();
  ppVar3 = (this->magicStrings).
           super__Vector_base<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar3 < (this->magicStrings).
               super__Vector_base<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
    psVar4 = &(ppVar3->second)._M_string_length;
    do {
      __n = psVar4[-3] - (long)psVar4[-4];
      if (__n == 0) {
        bVar5 = true;
      }
      else {
        iVar2 = bcmp((void *)psVar4[-4],local_25c,__n);
        bVar5 = iVar2 == 0;
      }
      if (bVar5) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar1 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (psVar4 + -1))->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar1,pcVar1 + *psVar4);
        if (bVar5) goto LAB_00126161;
      }
      ppVar3 = (pointer)(psVar4 + 3);
      psVar4 = psVar4 + 7;
    } while (ppVar3 < (this->magicStrings).
                      super__Vector_base<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::vector<char,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00126161:
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

std::string
    CodecManager::getFileTypeByMagicString( const std::string & filename )
        const
    {
        // support for reading the magic string from stdin has been dropped
        // it was not guaranteed to work by the Standard

        // get the magic string
        const unsigned int magiclen = 4;
        char fmagic[magiclen];
#ifdef VIGRA_NEED_BIN_STREAMS
        std::ifstream stream(filename.c_str(), std::ios::binary);
#else
        std::ifstream stream(filename.c_str());
#endif
        if(!stream.good())
        {
            std::string msg("Unable to open file '");
            msg += filename;
            msg += "'.";
            vigra_precondition(0, msg.c_str());
        }
        stream.read( fmagic, magiclen );
        stream.close();

        // compare with the known magic strings
        typedef std::vector< std::pair< std::vector<char>, std::string > >
            magic_type;
        for( magic_type::const_iterator iter = magicStrings.begin();
             iter < magicStrings.end(); ++iter ) {
            const std::vector<char> & magic = iter->first;
            if ( std::equal( magic.begin(), magic.end(), fmagic ) )
                return iter->second;
        }

        // did not find a matching string
        return std::string();
    }